

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_deserialize(sqlite3 *db,char *zSchema,uchar *pData,sqlite3_int64 szDb,
                       sqlite3_int64 szBuf,uint mFlags)

{
  MemStore *pMVar1;
  int iVar2;
  MemStore *pStore;
  int iDb;
  int rc;
  sqlite3_stmt *pStmt;
  char *zSql;
  MemFile *p;
  sqlite3_int64 sStack_30;
  uint mFlags_local;
  sqlite3_int64 szBuf_local;
  sqlite3_int64 szDb_local;
  uchar *pData_local;
  char *zSchema_local;
  sqlite3 *db_local;
  
  _iDb = (sqlite3_stmt *)0x0;
  p._4_4_ = mFlags;
  sStack_30 = szBuf;
  szBuf_local = szDb;
  szDb_local = (sqlite3_int64)pData;
  pData_local = (uchar *)zSchema;
  zSchema_local = (char *)db;
  sqlite3_mutex_enter(db->mutex);
  if (pData_local == (uchar *)0x0) {
    pData_local = (uchar *)**(undefined8 **)(zSchema_local + 0x20);
  }
  iVar2 = sqlite3FindDbName((sqlite3 *)zSchema_local,(char *)pData_local);
  if ((iVar2 < 2) && (iVar2 != 0)) {
    pStore._4_4_ = 1;
  }
  else {
    pStmt = (sqlite3_stmt *)sqlite3_mprintf("ATTACH x AS %Q",pData_local);
    if (pStmt == (sqlite3_stmt *)0x0) {
      pStore._4_4_ = 7;
    }
    else {
      pStore._4_4_ = sqlite3_prepare_v2((sqlite3 *)zSchema_local,(char *)pStmt,-1,
                                        (sqlite3_stmt **)&iDb,(char **)0x0);
      sqlite3_free(pStmt);
    }
    if (pStore._4_4_ == 0) {
      zSchema_local[0xc4] = (char)iVar2;
      zSchema_local[0xc6] = zSchema_local[0xc6] & 0xfbU | 4;
      iVar2 = sqlite3_step(_iDb);
      zSchema_local[0xc6] = zSchema_local[0xc6] & 0xfb;
      if (iVar2 == 0x65) {
        zSql = (char *)memdbFromDbSchema((sqlite3 *)zSchema_local,(char *)pData_local);
        if ((MemFile *)zSql == (MemFile *)0x0) {
          pStore._4_4_ = 1;
        }
        else {
          pMVar1 = ((MemFile *)zSql)->pStore;
          pMVar1->aData = (uchar *)szDb_local;
          szDb_local = 0;
          pMVar1->sz = szBuf_local;
          pMVar1->szAlloc = sStack_30;
          pMVar1->szMax = sStack_30;
          if (pMVar1->szMax < sqlite3Config.mxMemdbSize) {
            pMVar1->szMax = sqlite3Config.mxMemdbSize;
          }
          pMVar1->mFlags = p._4_4_;
          pStore._4_4_ = 0;
        }
      }
      else {
        pStore._4_4_ = 1;
      }
    }
  }
  sqlite3_finalize(_iDb);
  if ((szDb_local != 0) && ((p._4_4_ & 1) != 0)) {
    sqlite3_free((void *)szDb_local);
  }
  sqlite3_mutex_leave(*(sqlite3_mutex **)(zSchema_local + 0x18));
  return pStore._4_4_;
}

Assistant:

SQLITE_API int sqlite3_deserialize(
  sqlite3 *db,            /* The database connection */
  const char *zSchema,    /* Which DB to reopen with the deserialization */
  unsigned char *pData,   /* The serialized database content */
  sqlite3_int64 szDb,     /* Number bytes in the deserialization */
  sqlite3_int64 szBuf,    /* Total size of buffer pData[] */
  unsigned mFlags         /* Zero or more SQLITE_DESERIALIZE_* flags */
){
  MemFile *p;
  char *zSql;
  sqlite3_stmt *pStmt = 0;
  int rc;
  int iDb;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ){
    return SQLITE_MISUSE_BKPT;
  }
  if( szDb<0 ) return SQLITE_MISUSE_BKPT;
  if( szBuf<0 ) return SQLITE_MISUSE_BKPT;
#endif

  sqlite3_mutex_enter(db->mutex);
  if( zSchema==0 ) zSchema = db->aDb[0].zDbSName;
  iDb = sqlite3FindDbName(db, zSchema);
  testcase( iDb==1 );
  if( iDb<2 && iDb!=0 ){
    rc = SQLITE_ERROR;
    goto end_deserialize;
  }
  zSql = sqlite3_mprintf("ATTACH x AS %Q", zSchema);
  if( zSql==0 ){
    rc = SQLITE_NOMEM;
  }else{
    rc = sqlite3_prepare_v2(db, zSql, -1, &pStmt, 0);
    sqlite3_free(zSql);
  }
  if( rc ) goto end_deserialize;
  db->init.iDb = (u8)iDb;
  db->init.reopenMemdb = 1;
  rc = sqlite3_step(pStmt);
  db->init.reopenMemdb = 0;
  if( rc!=SQLITE_DONE ){
    rc = SQLITE_ERROR;
    goto end_deserialize;
  }
  p = memdbFromDbSchema(db, zSchema);
  if( p==0 ){
    rc = SQLITE_ERROR;
  }else{
    MemStore *pStore = p->pStore;
    pStore->aData = pData;
    pData = 0;
    pStore->sz = szDb;
    pStore->szAlloc = szBuf;
    pStore->szMax = szBuf;
    if( pStore->szMax<sqlite3GlobalConfig.mxMemdbSize ){
      pStore->szMax = sqlite3GlobalConfig.mxMemdbSize;
    }
    pStore->mFlags = mFlags;
    rc = SQLITE_OK;
  }

end_deserialize:
  sqlite3_finalize(pStmt);
  if( pData && (mFlags & SQLITE_DESERIALIZE_FREEONCLOSE)!=0 ){
    sqlite3_free(pData);
  }
  sqlite3_mutex_leave(db->mutex);
  return rc;
}